

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int coda_inflateValidate(z_streamp strm,int check)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = inflateStateCheck(strm);
  if (iVar1 == 0) {
    uVar2 = *(uint *)(strm->state + 0x10);
    if (check == 0) {
      uVar2 = uVar2 & 0xfffffffb;
    }
    else if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = uVar2 | 4;
    }
    *(uint *)(strm->state + 0x10) = uVar2;
    iVar1 = 0;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateValidate(z_streamp strm, int check) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}